

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall ACSStringPool::ReadStrings(ACSStringPool *this,PNGHandle *png,DWORD id)

{
  PoolEntry *pPVar1;
  char *data;
  uint uVar2;
  DWORD DVar3;
  DWORD DVar4;
  size_t len;
  uint *puVar5;
  long lVar6;
  long lVar7;
  char *str;
  int32_t poolsize;
  FPNGChunkArchive arc;
  char *local_340;
  uint local_334;
  FPNGChunkArchive local_330;
  
  Clear(this);
  uVar2 = M_FindPNGChunk(png,id);
  if (uVar2 != 0) {
    FPNGChunkArchive::FPNGChunkArchive(&local_330,png->File->File,id,(ulong)uVar2);
    local_340 = (char *)0x0;
    FArchive::operator<<(&local_330.super_FArchive,&local_334);
    TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Resize(&this->Pool,local_334);
    uVar2 = FArchive::ReadCount(&local_330.super_FArchive);
    lVar6 = 0;
    while (-1 < (int)uVar2) {
      lVar7 = (long)(int)lVar6;
      lVar6 = lVar6 << 0x20;
      puVar5 = &(this->Pool).Array[lVar7].LockCount;
      for (; lVar7 < (long)(ulong)uVar2; lVar7 = lVar7 + 1) {
        *(undefined8 *)(puVar5 + -1) = 0xfffffffe;
        lVar6 = lVar6 + 0x100000000;
        puVar5 = puVar5 + 6;
      }
      FArchive::operator<<(&local_330.super_FArchive,&local_340);
      data = local_340;
      len = strlen(local_340);
      DVar3 = SuperFastHash(data,len);
      lVar6 = lVar6 >> 0x20;
      FString::operator=(&(this->Pool).Array[lVar6].Str,local_340);
      (this->Pool).Array[lVar6].Hash = DVar3;
      DVar4 = FArchive::ReadCount(&local_330.super_FArchive);
      pPVar1 = (this->Pool).Array;
      pPVar1[lVar6].LockCount = DVar4;
      pPVar1[lVar6].Next = this->PoolBuckets[(ulong)DVar3 % 0xfb];
      this->PoolBuckets[(ulong)DVar3 % 0xfb] = (uint)lVar7;
      uVar2 = FArchive::ReadCount(&local_330.super_FArchive);
      lVar6 = lVar7 + 1;
    }
    if (local_340 != (char *)0x0) {
      operator_delete__(local_340);
    }
    FindFirstFreeEntry(this,0);
    FPNGChunkArchive::~FPNGChunkArchive(&local_330);
  }
  return;
}

Assistant:

void ACSStringPool::ReadStrings(PNGHandle *png, DWORD id)
{
	Clear();

	size_t len = M_FindPNGChunk(png, id);
	if (len != 0)
	{
		FPNGChunkArchive arc(png->File->GetFile(), id, len);
		int32_t i, j, poolsize;
		unsigned int h, bucketnum;
		char *str = NULL;

		arc << poolsize;

		Pool.Resize(poolsize);
		i = 0;
		j = arc.ReadCount();
		while (j >= 0)
		{
			// Mark skipped entries as free
			for (; i < j; ++i)
			{
				Pool[i].Next = FREE_ENTRY;
				Pool[i].LockCount = 0;
			}
			arc << str;
			h = SuperFastHash(str, strlen(str));
			bucketnum = h % NUM_BUCKETS;
			Pool[i].Str = str;
			Pool[i].Hash = h;
			Pool[i].LockCount = arc.ReadCount();
			Pool[i].Next = PoolBuckets[bucketnum];
			PoolBuckets[bucketnum] = i;
			i++;
			j = arc.ReadCount();
		}
		if (str != NULL)
		{
			delete[] str;
		}
		FindFirstFreeEntry(0);
	}
}